

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall helics::Publication::publish(Publication *this,bool val)

{
  ValueFederate *pVVar1;
  string_view val_00;
  char *pcVar2;
  bool bVar3;
  undefined7 in_register_00000031;
  string_view val_01;
  allocator<char> local_b1;
  string_view bstring;
  data_view local_a0;
  SmallBuffer db;
  
  pVVar1 = this->fed;
  pcVar2 = "+0";
  if ((int)CONCAT71(in_register_00000031,val) != 0) {
    pcVar2 = "*1";
  }
  val_01._M_str = pcVar2 + 1;
  bstring._M_len = 1;
  bstring._M_str = val_01._M_str;
  if (this->changeDetectionEnabled == true) {
    val_01._M_len = 1;
    bVar3 = changeDetected(&this->prevValue,val_01,this->delta);
    if (!bVar3) {
      return;
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&db,(basic_string_view<char,_std::char_traits<char>_> *)&bstring,&local_b1)
    ;
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db);
    std::__cxx11::string::~string((string *)&db);
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    val_00._M_str = bstring._M_str;
    val_00._M_len = bstring._M_len;
    typeConvert(&db,this->pubType,val_00);
    local_a0.dblock._M_len = db.bufferSize;
    local_a0.dblock._M_str = (char *)db.heap;
    local_a0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    SmallBuffer::~SmallBuffer(&db);
  }
  return;
}

Assistant:

void Publication::publish(bool val)
{
    bool doPublish = (fed != nullptr);
    std::string_view bstring = val ? "1" : "0";
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, bstring, delta)) {
            prevValue = std::string(bstring);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, bstring);
        fed->publishBytes(*this, db);
    }
}